

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# claim_strategy.h
# Opt level: O3

int64_t __thiscall
disruptor::SingleThreadedStrategy::IncrementAndGet
          (SingleThreadedStrategy *this,Sequence *cursor,
          vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *dependents,
          size_t delta)

{
  pointer ppSVar1;
  pointer ppSVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  lVar5 = delta + this->last_claimed_sequence_;
  this->last_claimed_sequence_ = lVar5;
  lVar6 = lVar5 - this->buffer_size_;
  if (this->last_consumer_sequence_ < lVar6) {
    ppSVar1 = (dependents->
              super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppSVar2 = (dependents->
              super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppSVar1 != ppSVar2) {
      do {
        lVar3 = 0x7fffffffffffffff;
        do {
          lVar4 = ((*ppSVar1)->sequence_).super___atomic_base<long>._M_i;
          if (lVar3 < lVar4) {
            lVar4 = lVar3;
          }
          ppSVar1 = ppSVar1 + 1;
          lVar3 = lVar4;
        } while (ppSVar1 != ppSVar2);
        if (lVar6 <= lVar4) {
          return lVar5;
        }
        sched_yield();
        ppSVar1 = (dependents->
                  super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start;
        ppSVar2 = (dependents->
                  super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>)
                  ._M_impl.super__Vector_impl_data._M_finish;
      } while (ppSVar1 != ppSVar2);
    }
  }
  return lVar5;
}

Assistant:

int64_t IncrementAndGet(Sequence& cursor,
                          const std::vector<Sequence*>& dependents,
                          size_t delta = 1) {
    const int64_t next_sequence = (last_claimed_sequence_ += delta);
    const int64_t wrap_point = next_sequence - buffer_size_;
    if (last_consumer_sequence_ < wrap_point) {
      while (GetMinimumSequence(dependents) < wrap_point) {
        // TODO: configurable yield strategy
        std::this_thread::yield();
      }
    }
    return next_sequence;
  }